

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O1

void __thiscall CRegexStack::save_loop_var(CRegexStack *this,int id,short *loop_vars)

{
  char *ret;
  int *piVar1;
  int *piVar2;
  
  if ((long)this->sp_ != -1) {
    piVar1 = (int *)(this->buf_ + this->used_);
    for (piVar2 = (int *)(this->buf_ + (long)this->sp_ + 0x24); piVar2 < piVar1; piVar2 = piVar2 + 3
        ) {
      if (*piVar2 == id + 10) {
        piVar1 = (int *)0x0;
        goto LAB_002b84da;
      }
    }
    this->used_ = this->used_ + 0xc;
    *piVar1 = id + 10;
LAB_002b84da:
    if (piVar1 != (int *)0x0) {
      *(short *)(piVar1 + 1) = loop_vars[id];
    }
  }
  return;
}

Assistant:

void save_loop_var(int id, const short *loop_vars)
    {
        /* 
         *   allocate a new slot if needed and save the value; note that
         *   loop variables are identified by the loop variable ID plus the
         *   base index RE_GROUP_REG_CNT 
         */
        regex_stack_var *var;
        if (sp_ != -1 && (var = new_reg_or_var(id + RE_GROUP_REG_CNT)) != 0)
            var->val.loopvar = loop_vars[id];
    }